

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O1

nghttp2_ssize
hd_inflate_read_len(nghttp2_hd_inflater *inflater,int *rfin,uint8_t *in,uint8_t *last,size_t prefix,
                   size_t maxlen)

{
  undefined8 in_RAX;
  nghttp2_ssize nVar1;
  nghttp2_ssize nVar2;
  uint32_t out;
  
  out = (uint32_t)((ulong)in_RAX >> 0x20);
  *rfin = 0;
  nVar1 = decode_length(&out,&inflater->shift,rfin,(uint32_t)inflater->left,inflater->shift,in,last,
                        prefix);
  nVar2 = -0x20b;
  if ((nVar1 != -1) && (out <= maxlen)) {
    inflater->left = (ulong)out;
    nVar2 = nVar1;
  }
  return nVar2;
}

Assistant:

static nghttp2_ssize hd_inflate_read_len(nghttp2_hd_inflater *inflater,
                                         int *rfin, const uint8_t *in,
                                         const uint8_t *last, size_t prefix,
                                         size_t maxlen) {
  nghttp2_ssize rv;
  uint32_t out;

  *rfin = 0;

  rv = decode_length(&out, &inflater->shift, rfin, (uint32_t)inflater->left,
                     inflater->shift, in, last, prefix);

  if (rv == -1) {
    DEBUGF("inflatehd: integer decoding failed\n");
    return NGHTTP2_ERR_HEADER_COMP;
  }

  if (out > maxlen) {
    DEBUGF("inflatehd: integer exceeded the maximum value %zu\n", maxlen);
    return NGHTTP2_ERR_HEADER_COMP;
  }

  inflater->left = out;

  DEBUGF("inflatehd: decoded integer is %u\n", out);

  return rv;
}